

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O3

ConversionResult
convertUTF::ConvertUTF16toUTF32
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  ushort uVar1;
  ushort *puVar2;
  ConversionResult CVar3;
  UTF32 UVar4;
  UTF32 *pUVar5;
  ushort *puVar6;
  
  pUVar5 = *targetStart;
  puVar2 = *sourceStart;
  do {
    CVar3 = conversionOK;
    if (sourceEnd <= puVar2) {
LAB_00181cc9:
      *sourceStart = puVar2;
      *targetStart = pUVar5;
      return CVar3;
    }
    puVar6 = puVar2 + 1;
    uVar1 = *puVar2;
    UVar4 = (UTF32)uVar1;
    if ((uVar1 & 0xfc00) == 0xd800) {
      if (sourceEnd <= puVar6) {
        CVar3 = sourceExhausted;
        goto LAB_00181cc9;
      }
      if ((*puVar6 & 0xfc00) == 0xdc00) {
        UVar4 = (uint)uVar1 * 0x400 + (uint)*puVar6 + 0xfca02400;
        puVar6 = puVar2 + 2;
      }
      else if (flags == strictConversion) goto LAB_00181cb9;
    }
    else if ((flags == strictConversion) && ((uVar1 & 0xfc00) == 0xdc00)) {
LAB_00181cb9:
      CVar3 = sourceIllegal;
      goto LAB_00181cc9;
    }
    if (targetEnd <= pUVar5) {
      CVar3 = targetExhausted;
      goto LAB_00181cc9;
    }
    *pUVar5 = UVar4;
    pUVar5 = pUVar5 + 1;
    puVar2 = puVar6;
  } while( true );
}

Assistant:

ConversionResult ConvertUTF16toUTF32(const UTF16** sourceStart, const UTF16* sourceEnd, UTF32** targetStart,
                                     const UTF32* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF16* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd)
    {
        const UTF16* oldSource = source; /*  In case we have to back up because of target overflow. */
        UTF32 ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END)
        {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd)
            {
                UTF32 ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END)
                {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift) + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                }
                else if (flags == ConversionFlags::strictConversion)
                {             /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
            }
            else
            {             /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = ConversionResult::sourceExhausted;
                break;
            }
        }
        else if (flags == ConversionFlags::strictConversion)
        {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END)
            {
                --source; /* return to the illegal value itself */
                result = ConversionResult::sourceIllegal;
                break;
            }
        }
        if (target >= targetEnd)
        {
            source = oldSource; /* Back up source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        *target++ = ch;
    }
    *sourceStart = source;
    *targetStart = target;
#ifdef CVTUTF_DEBUG
    if (result == sourceIllegal)
    {
        fprintf(stderr, "ConvertUTF16toUTF32 illegal seq 0x%04x,%04x\n", ch, ch2);
        fflush(stderr);
    }
#endif
    return result;
}